

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O0

int __thiscall QTemporaryFileEngine::remove(QTemporaryFileEngine *this,char *__filename)

{
  bool bVar1;
  uint uVar2;
  undefined7 extraout_var;
  QFSFileEnginePrivate *unaff_retaddr;
  QFSFileEnginePrivate *d;
  undefined1 local_1;
  QFileSystemEntry *pQVar3;
  
  d_func((QTemporaryFileEngine *)0x2f850c);
  QFSFileEnginePrivate::unmapAll(unaff_retaddr);
  QFSFileEngine::close(&this->super_QFSFileEngine,(int)__filename);
  bVar1 = isUnnamedFile(this);
  pQVar3 = (QFileSystemEntry *)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    local_1 = 1;
  }
  else {
    pQVar3 = (QFileSystemEntry *)this;
    if (((ulong)(((QFileSystemEntry *)this)->m_nativeFilePath).d.ptr & 1) == 0) {
      uVar2 = QFSFileEngine::remove(&this->super_QFSFileEngine,__filename);
      pQVar3 = (QFileSystemEntry *)(ulong)uVar2;
      if ((uVar2 & 1) != 0) {
        pQVar3 = (QFileSystemEntry *)this;
        QFileSystemEntry::clear((QFileSystemEntry *)this);
        *(byte *)&(pQVar3->m_nativeFilePath).d.ptr =
             *(bool *)((long)&(pQVar3->m_nativeFilePath).d.ptr + 1) & 1;
        local_1 = 1;
        goto LAB_002f857f;
      }
    }
    local_1 = 0;
  }
LAB_002f857f:
  return (int)CONCAT71((int7)((ulong)pQVar3 >> 8),local_1);
}

Assistant:

bool QTemporaryFileEngine::remove()
{
    Q_D(QFSFileEngine);
    // Since the QTemporaryFileEngine::close() does not really close the file,
    // we must explicitly call QFSFileEngine::close() before we remove it.
    d->unmapAll();
    QFSFileEngine::close();
    if (isUnnamedFile())
        return true;
    if (!filePathIsTemplate && QFSFileEngine::remove()) {
        d->fileEntry.clear();
        // If a QTemporaryFile is constructed using a template file path, the path
        // is generated in QTemporaryFileEngine::open() and then filePathIsTemplate
        // is set to false. If remove() and then open() are called on the same
        // QTemporaryFile, the path is not regenerated. Here we ensure that if the
        // file path was generated, it will be generated again in the scenario above.
        filePathIsTemplate = filePathWasTemplate;
        return true;
    }
    return false;
}